

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_geom::load_1865(xr_level_geom *this,xr_reader *r)

{
  uint *puVar1;
  pointer pxVar2;
  xr_ibuf *pxVar3;
  xr_swibuf *pxVar4;
  uint __line;
  xr_level_geom *pxVar5;
  xr_reader *this_00;
  xr_reader *this_01;
  d3d_vertex_element *ve;
  d3d_vertex_element *pdVar6;
  size_t n_ve;
  xr_ibuf *this_02;
  xr_swibuf *this_03;
  pointer this_04;
  xr_reader *s;
  xr_level_geom *local_40;
  xr_reader *local_38;
  
  local_38 = r;
  this_01 = xr_reader::open_chunk(r,10);
  if (this_01 == (xr_reader *)0x0) {
    __line = 0x37;
  }
  else {
    puVar1 = (this_01->field_2).m_p_u32;
    (this_01->field_2).m_p = (uint8_t *)(puVar1 + 1);
    s = this_01;
    std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
              (&this->m_vbufs,(ulong)*puVar1);
    pxVar2 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40 = this;
    for (this_04 = (this->m_vbufs).
                   super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 = local_38, this_04 != pxVar2;
        this_04 = this_04 + 1) {
      ve = xr_reader::skip<xray_re::d3d_vertex_element>(this_01,1);
      n_ve = 0;
      do {
        pdVar6 = xr_reader::skip<xray_re::d3d_vertex_element>(this_01,1);
        n_ve = n_ve + 1;
      } while (pdVar6->type != '\x11');
      puVar1 = (this_01->field_2).m_p_u32;
      (this_01->field_2).m_p = (uint8_t *)(puVar1 + 1);
      xr_vbuf::load_d3d9(this_04,this_01,(ulong)*puVar1,ve,n_ve);
    }
    xr_reader::close_chunk(local_38,&s);
    s = xr_reader::open_chunk(this_00,9);
    pxVar5 = local_40;
    if (s != (xr_reader *)0x0) {
      puVar1 = (s->field_2).m_p_u32;
      (s->field_2).m_p = (uint8_t *)(puVar1 + 1);
      std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::resize
                (&local_40->m_ibufs,(ulong)*puVar1);
      pxVar3 = (pxVar5->m_ibufs).
               super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_02 = (pxVar5->m_ibufs).
                     super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>._M_impl
                     .super__Vector_impl_data._M_start; this_02 != pxVar3; this_02 = this_02 + 1) {
        puVar1 = (s->field_2).m_p_u32;
        (s->field_2).m_p = (uint8_t *)(puVar1 + 1);
        xr_ibuf::load(this_02,s,(ulong)*puVar1);
      }
      xr_reader::close_chunk(this_00,&s);
      s = xr_reader::open_chunk(this_00,0xb);
      if (s != (xr_reader *)0x0) {
        puVar1 = (s->field_2).m_p_u32;
        (s->field_2).m_p = (uint8_t *)(puVar1 + 1);
        std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>::resize
                  (&pxVar5->m_swibufs,(ulong)*puVar1);
        pxVar4 = (pxVar5->m_swibufs).
                 super__Vector_base<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (this_03 = (pxVar5->m_swibufs).
                       super__Vector_base<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>.
                       _M_impl.super__Vector_impl_data._M_start; this_03 != pxVar4;
            this_03 = this_03 + 1) {
          xr_swibuf::load(this_03,s);
        }
        xr_reader::close_chunk(this_00,&s);
      }
      return;
    }
    __line = 0x42;
  }
  s = (xr_reader *)0x0;
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                ,__line,"void xray_re::xr_level_geom::load_1865(xr_reader &)");
}

Assistant:

void xr_level_geom::load_1865(xr_reader& r)
{
	xr_reader* s = r.open_chunk(FSL12_VB);
	xr_assert(s);
	m_vbufs.resize(s->r_u32());
	for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
		const d3d_vertex_element *ve = s->skip<d3d_vertex_element>();
		size_t n_ve = 1;
		for (; s->skip<d3d_vertex_element>()->type != D3D_VE_TYPE_UNUSED; ++n_ve) {}
		it->load_d3d9(*s, s->r_u32(), ve, n_ve);
	}
	r.close_chunk(s);

	s = r.open_chunk(FSL12_IB);
	xr_assert(s);
	m_ibufs.resize(s->r_u32());
	for (xr_ibuf_vec_it it = m_ibufs.begin(), end = m_ibufs.end(); it != end; ++it)
		it->load(*s, s->r_u32());
	r.close_chunk(s);

	s = r.open_chunk(FSL12_SWIS);
	if (s != 0)
	{
		m_swibufs.resize(s->r_u32());
		for (xr_swibuf_vec_it it = m_swibufs.begin(), end = m_swibufs.end(); it != end; ++it)
			it->load(*s);
		r.close_chunk(s);
	}
}